

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

void GetChunk(ListChunkTraverseInfo *info,Col_Word **chunkPtr,int reverse)

{
  Col_Word *pCVar1;
  long local_90;
  long local_78;
  long local_68;
  uint local_54;
  uint local_50;
  uint local_4c;
  long local_48;
  size_t last;
  size_t first;
  Col_CustomListType *typeInfo;
  size_t leftLength;
  uint local_20;
  int depth;
  int type;
  int reverse_local;
  Col_Word **chunkPtr_local;
  ListChunkTraverseInfo *info_local;
  
  depth = reverse;
  _type = chunkPtr;
  chunkPtr_local = (Col_Word **)info;
  while( true ) {
    while( true ) {
      while( true ) {
        if (chunkPtr_local[1] == (Col_Word *)0x0) {
          local_4c = 0;
        }
        else {
          if (((ulong)chunkPtr_local[1] & 0xf) == 0) {
            if ((*chunkPtr_local[1] & 2) == 0) {
              local_54 = 0xffffffff;
            }
            else {
              local_54 = (byte)*chunkPtr_local[1] & 0xfffffffe;
            }
            local_50 = local_54;
          }
          else {
            local_50 = immediateWordTypes[(ulong)chunkPtr_local[1] & 0x1f];
          }
          local_4c = local_50;
        }
        local_20 = local_4c;
        if (local_4c != 0xfffffffa) break;
        chunkPtr_local[1] = (Col_Word *)((ulong)chunkPtr_local[1] & 0xfffffffffffffff7);
      }
      if (local_4c != 0x1e) break;
      chunkPtr_local[3] = (Col_Word *)(chunkPtr_local[1][2] + (long)chunkPtr_local[3]);
      chunkPtr_local[1] = (Col_Word *)chunkPtr_local[1][1];
    }
    if ((local_4c != 0x22) && (local_4c != 0x26)) break;
    typeInfo = (Col_CustomListType *)(ulong)*(ushort *)((long)chunkPtr_local[1] + 2);
    if (typeInfo == (Col_CustomListType *)0x0) {
      typeInfo = (Col_CustomListType *)Col_ListLength(chunkPtr_local[1][2]);
    }
    if (depth == 0) {
      local_68 = (long)chunkPtr_local[4] + -1;
    }
    else {
      local_68 = 0;
    }
    if ((Col_CustomListType *)((long)chunkPtr_local[3] + local_68) < typeInfo) {
      chunkPtr_local[1] = (Col_Word *)chunkPtr_local[1][2];
    }
    else {
      if (depth == 0) {
        local_78 = 0;
      }
      else {
        local_78 = (long)chunkPtr_local[4] + -1;
      }
      if ((Col_CustomListType *)((long)chunkPtr_local[3] - local_78) < typeInfo) {
        leftLength._4_4_ = (uint)*(byte *)((long)chunkPtr_local[1] + 1);
        *(undefined4 *)(*chunkPtr_local + (long)(int)(leftLength._4_4_ - 1) * 3) =
             *(undefined4 *)((long)chunkPtr_local + 0x2c);
        *(uint *)((long)chunkPtr_local + 0x2c) = leftLength._4_4_;
        if (depth == 0) {
          (*chunkPtr_local)[(long)(int)(leftLength._4_4_ - 1) * 3 + 1] = chunkPtr_local[1][3];
          (*chunkPtr_local)[(long)(int)(leftLength._4_4_ - 1) * 3 + 2] =
               (long)chunkPtr_local[4] - ((long)typeInfo - (long)chunkPtr_local[3]);
          chunkPtr_local[4] = (Col_Word *)((long)typeInfo - (long)chunkPtr_local[3]);
          chunkPtr_local[1] = (Col_Word *)chunkPtr_local[1][2];
        }
        else {
          (*chunkPtr_local)[(long)(int)(leftLength._4_4_ - 1) * 3 + 1] = chunkPtr_local[1][2];
          (*chunkPtr_local)[(long)(int)(leftLength._4_4_ - 1) * 3 + 2] =
               (long)chunkPtr_local[4] - ((long)chunkPtr_local[3] + (1 - (long)typeInfo));
          chunkPtr_local[3] = (Col_Word *)((long)chunkPtr_local[3] - (long)typeInfo);
          chunkPtr_local[4] = (Col_Word *)((long)chunkPtr_local[3] + 1);
          chunkPtr_local[1] = (Col_Word *)chunkPtr_local[1][3];
        }
      }
      else {
        chunkPtr_local[3] = (Col_Word *)((long)chunkPtr_local[3] - (long)typeInfo);
        chunkPtr_local[1] = (Col_Word *)chunkPtr_local[1][3];
      }
    }
  }
  switch(local_4c) {
  case 0x16:
  case 0x1a:
    if (depth == 0) {
      local_90 = 0;
    }
    else {
      local_90 = (long)chunkPtr_local[4] + -1;
    }
    *_type = chunkPtr_local[1] + (long)chunkPtr_local[3] + (2 - local_90);
    break;
  case 0xfffffff9:
    *_type = (Col_Word *)0xffffffffffffffff;
    break;
  default:
    break;
  case 0xffffffff:
    first = *chunkPtr_local[1] & 0xfffffffffffffffe;
    if (*(long *)(first + 0x38) == 0) {
      chunkPtr_local[4] = (Col_Word *)0x1;
      pCVar1 = (Col_Word *)(**(code **)(first + 0x30))(chunkPtr_local[1],chunkPtr_local[3]);
      chunkPtr_local[2] = pCVar1;
      *_type = (Col_Word *)(chunkPtr_local + 2);
    }
    else {
      (**(code **)(first + 0x38))(chunkPtr_local[1],chunkPtr_local[3],_type,&last,&local_48);
      if (depth == 0) {
        if ((Col_Word *)((local_48 - (long)chunkPtr_local[3]) + 1U) < chunkPtr_local[4]) {
          chunkPtr_local[4] = (Col_Word *)((local_48 - (long)chunkPtr_local[3]) + 1);
        }
        *_type = *_type + ((long)chunkPtr_local[3] - last);
      }
      else if ((Col_Word *)((long)chunkPtr_local[3] + (1 - last)) < chunkPtr_local[4]) {
        chunkPtr_local[4] = (Col_Word *)((long)chunkPtr_local[3] + (1 - last));
      }
      else {
        *_type = *_type + (long)chunkPtr_local[3] + (-((long)chunkPtr_local[4] + -1) - last);
      }
    }
  }
  return;
}

Assistant:

static void
GetChunk(
    RopeChunkTraverseInfo *info,    /*!< Traversal info. */
    Col_RopeChunk *chunkPtr,        /*!< Chunk info for leaf. */
    int reverse)                    /*!< Whether to traverse in reverse order.*/
{
    int type;

    for (;;) {
        /*
         * Descend into structure until we find a suitable leaf.
         */

        type = WORD_TYPE(info->rope);
        switch (type) {
        case WORD_TYPE_SUBROPE:
            /*
             * Subrope: recurse on source rope.
             */

            info->start += WORD_SUBROPE_FIRST(info->rope);
            info->rope = WORD_SUBROPE_SOURCE(info->rope);
            continue;

        case WORD_TYPE_CONCATROPE: {
            /*
             * Concat: descend into covered arms.
             */

            int depth;
            size_t leftLength = WORD_CONCATROPE_LEFT_LENGTH(info->rope);
            if (leftLength == 0) {
                leftLength = Col_RopeLength(WORD_CONCATROPE_LEFT(info->rope));
            }
            if (info->start + (reverse ? 0 : info->max-1) < leftLength) {
                /*
                 * Recurse on left arm only.
                 */

                info->rope = WORD_CONCATROPE_LEFT(info->rope);
                continue;
            }
            if (info->start - (reverse ? info->max-1 : 0) >= leftLength) {
                /*
                 * Recurse on right arm only.
                 */

                info->start -= leftLength;
                info->rope = WORD_CONCATROPE_RIGHT(info->rope);
                continue;
            }

            /*
             * Push right (resp. left for reverse) onto stack and recurse on
             * left (resp. right).
             */

            ASSERT(info->backtracks);
            depth = WORD_CONCATROPE_DEPTH(info->rope);
            ASSERT(depth <= info->maxDepth);
            info->backtracks[depth-1].prevDepth = info->prevDepth;
            info->prevDepth = depth;
            if (reverse) {
                ASSERT(info->start >= leftLength);
                info->backtracks[depth-1].rope
                        = WORD_CONCATROPE_LEFT(info->rope);
                info->backtracks[depth-1].max = info->max
                        - (info->start-leftLength+1);
                info->start -= leftLength;
                info->max = info->start+1;
                info->rope = WORD_CONCATROPE_RIGHT(info->rope);
            } else {
                ASSERT(info->start < leftLength);
                info->backtracks[depth-1].rope
                        = WORD_CONCATROPE_RIGHT(info->rope);
                info->backtracks[depth-1].max = info->max
                        - (leftLength-info->start);
                info->max = leftLength-info->start;
                info->rope = WORD_CONCATROPE_LEFT(info->rope);
            }
            continue;
            }

            /* WORD_TYPE_UNKNOWN */
        }

        break;
    }

    /*
     * Get leaf data.
     */

    ASSERT(info->start + (reverse ? info->max-1 : 0) >= 0);
    ASSERT(info->start + (reverse ? 0 : info->max-1) < Col_RopeLength(info->rope));
    switch (type) {
    case WORD_TYPE_CHARBOOL:
        ASSERT(WORD_CHAR_WIDTH(info->rope));
        ASSERT(info->start == 0);
        ASSERT(info->max == 1);
        chunkPtr->format = (Col_StringFormat) WORD_CHAR_WIDTH(info->rope);
        info->c = WORD_CHAR_CP(info->rope);
        chunkPtr->data = &info->c;
        break;

    case WORD_TYPE_SMALLSTR:
        chunkPtr->format = COL_UCS1;
        chunkPtr->data = WORD_SMALLSTR_DATA(info->rope) + info->start
                - (reverse ? info->max-1 : 0);
        break;

    case WORD_TYPE_UCSSTR: {
        /*
         * Fixed-width flat strings: traverse range of chars.
         */

        chunkPtr->format = (Col_StringFormat) WORD_UCSSTR_FORMAT(info->rope);
        chunkPtr->data = WORD_UCSSTR_DATA(info->rope)
                + (info->start - (reverse ? info->max-1 : 0))
                * CHAR_WIDTH(chunkPtr->format);
        break;
        }

    case WORD_TYPE_UTFSTR:
        /*
         * Variable-width flat string.
         */

        chunkPtr->format = (Col_StringFormat) WORD_UTFSTR_FORMAT(info->rope);
        switch (chunkPtr->format) {
        case COL_UTF8:
            chunkPtr->data = Col_Utf8Addr(
                    (const Col_Char1 *) WORD_UTFSTR_DATA(info->rope),
                    info->start - (reverse ? info->max-1 : 0),
                    WORD_UTFSTR_LENGTH(info->rope),
                    WORD_UTFSTR_BYTELENGTH(info->rope));
            break;

        case COL_UTF16:
            chunkPtr->data = Col_Utf16Addr(
                    (const Col_Char2 *) WORD_UTFSTR_DATA(info->rope),
                    info->start - (reverse ? info->max-1 : 0),
                    WORD_UTFSTR_LENGTH(info->rope),
                    WORD_UTFSTR_BYTELENGTH(info->rope));
            break;
        }
        break;

    case WORD_TYPE_CUSTOM: {
        Col_CustomRopeType *typeInfo
                = (Col_CustomRopeType *) WORD_TYPEINFO(info->rope);
        ASSERT(typeInfo->type.type == COL_ROPE);
        if (typeInfo->chunkAtProc) {
            /*
             * Get chunk at start index.
             */

            size_t first, last;
            typeInfo->chunkAtProc(info->rope, info->start, chunkPtr, &first,
                    &last);

            /*
             * Restrict to traversed range.
             */

            if (reverse) {
                if (info->max > info->start-first+1) {
                    info->max = info->start-first+1;
                } else {
                    switch (chunkPtr->format) {
                    case COL_UCS1:
                    case COL_UCS2:
                    case COL_UCS4:
                        chunkPtr->data = (const char *) chunkPtr->data
                                + ((info->start-first)-(info->max-1))
                                * CHAR_WIDTH(chunkPtr->format);
                        break;

                    case COL_UTF8:
                        chunkPtr->data = Col_Utf8Addr(
                                (const Col_Char1 *) chunkPtr->data,
                                ((info->start-first)-(info->max-1)),
                                last-first+1, chunkPtr->byteLength);
                        break;

                    case COL_UTF16:
                        chunkPtr->data = Col_Utf16Addr(
                                (const Col_Char2 *) chunkPtr->data,
                                ((info->start-first)-(info->max-1)),
                                last-first+1, chunkPtr->byteLength);
                        break;
                    }
                }
            } else {
                if (info->max > last-info->start+1) {
                    info->max = last-info->start+1;
                }
                switch (chunkPtr->format) {
                case COL_UCS1:
                case COL_UCS2:
                case COL_UCS4:
                    chunkPtr->data = (const char *) chunkPtr->data
                            + (info->start-first)
                            * CHAR_WIDTH(chunkPtr->format);
                    break;

                case COL_UTF8:
                    chunkPtr->data = Col_Utf8Addr(
                            (const Col_Char1 *) chunkPtr->data,
                            (info->start-first), last-first+1,
                            chunkPtr->byteLength);
                    break;

                case COL_UTF16:
                    chunkPtr->data = Col_Utf16Addr(
                            (const Col_Char2 *) chunkPtr->data,
                            (info->start-first), last-first+1,
                            chunkPtr->byteLength);
                    break;
                }
            }
        } else {
            /*
             * Traverse chars individually.
             */

            info->max = 1;
            chunkPtr->format = COL_UCS4;
            info->c = typeInfo->charAtProc(info->rope, info->start);
            chunkPtr->data = &info->c;
        }
        break;
        }

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
    }
}